

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnTable(SharedValidator *this,Location *loc,Type elem_type,Limits *limits)

{
  pointer *ppTVar1;
  iterator __position;
  Result RVar2;
  byte bVar3;
  bool bVar4;
  TableType local_50;
  
  if (((this->tables_).
       super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       (this->tables_).
       super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
       ._M_impl.super__Vector_impl_data._M_start) ||
     ((this->options_).features.reference_types_enabled_ != false)) {
    bVar4 = false;
  }
  else {
    RVar2 = PrintError(this,loc,"only one table allowed");
    bVar4 = RVar2.enum_ == Error;
  }
  RVar2 = CheckLimits(this,loc,limits,0xffffffff,"elems");
  bVar3 = RVar2.enum_ == Error | bVar4;
  if (limits->is_shared == true) {
    RVar2 = PrintError(this,loc,"tables may not be shared");
    bVar3 = bVar3 | RVar2.enum_ == Error;
  }
  if ((elem_type.enum_ != Funcref) && ((this->options_).features.reference_types_enabled_ == false))
  {
    RVar2 = PrintError(this,loc,"tables must have funcref type");
    bVar3 = bVar3 | RVar2.enum_ == Error;
  }
  if ((0x1a < (uint)(elem_type.enum_ + ~(Func|I32U))) ||
     ((0x40001c1U >> (elem_type.enum_ + ~(Func|I32U) & 0x1fU) & 1) == 0)) {
    RVar2 = PrintError(this,loc,"tables must have reference types");
    bVar3 = bVar3 | RVar2.enum_ == Error;
  }
  local_50.limits.has_max = limits->has_max;
  local_50.limits.is_shared = limits->is_shared;
  local_50.limits._18_6_ = *(undefined6 *)&limits->field_0x12;
  local_50.limits.initial = limits->initial;
  local_50.limits.max = limits->max;
  __position._M_current =
       (this->tables_).
       super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->tables_).
      super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_50.element.enum_ = elem_type.enum_;
    std::vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
    ::_M_realloc_insert<wabt::SharedValidator::TableType>(&this->tables_,__position,&local_50);
  }
  else {
    ((__position._M_current)->limits).max = local_50.limits.max;
    ((__position._M_current)->limits).has_max = local_50.limits.has_max;
    ((__position._M_current)->limits).is_shared = local_50.limits.is_shared;
    *(undefined6 *)&((__position._M_current)->limits).field_0x12 = local_50.limits._18_6_;
    *(ulong *)__position._M_current = CONCAT44(local_50._4_4_,elem_type.enum_);
    ((__position._M_current)->limits).initial = local_50.limits.initial;
    ppTVar1 = &(this->tables_).
               super__Vector_base<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = bVar3;
  return (Result)RVar2.enum_;
}

Assistant:

Result SharedValidator::OnTable(const Location& loc,
                                Type elem_type,
                                const Limits& limits) {
  Result result = Result::Ok;
  if (tables_.size() > 0 && !options_.features.reference_types_enabled()) {
    result |= PrintError(loc, "only one table allowed");
  }
  result |= CheckLimits(loc, limits, UINT32_MAX, "elems");

  if (limits.is_shared) {
    result |= PrintError(loc, "tables may not be shared");
  }
  if (elem_type != Type::Funcref &&
      !options_.features.reference_types_enabled()) {
    result |= PrintError(loc, "tables must have funcref type");
  }
  if (!elem_type.IsRef()) {
    result |= PrintError(loc, "tables must have reference types");
  }

  tables_.push_back(TableType{elem_type, limits});
  return result;
}